

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

string * __thiscall Tokenizer::makeErrorMessage(Tokenizer *this,string *err)

{
  ostream *poVar1;
  string *in_RDX;
  Stream *in_RSI;
  string *in_RDI;
  stringstream ss;
  string local_1d0 [48];
  stringstream local_1a0 [16];
  ostream local_190 [312];
  Mark *in_stack_ffffffffffffffa8;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"ERROR: (");
  Stream::getMark(in_RSI);
  Mark::to_string_abi_cxx11_(in_stack_ffffffffffffffa8);
  poVar1 = std::operator<<(poVar1,local_1d0);
  poVar1 = std::operator<<(poVar1,") ");
  std::operator<<(poVar1,in_RDX);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string Tokenizer::makeErrorMessage(std::string err) const
{
  std::stringstream ss;
  ss << "ERROR: (" << stream_.getMark().to_string() << ") " << err;
  return ss.str();
}